

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O0

void __thiscall OpenMD::Shake::Shake(Shake *this,SimInfo *info)

{
  undefined1 uVar1;
  uint uVar2;
  ConstraintWriter *this_00;
  Snapshot *info_00;
  void *pvVar3;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  Globals *simParams;
  SimInfo *in_stack_fffffffffffffed8;
  SimInfo *in_stack_fffffffffffffee0;
  errorStruct *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  Globals *local_28;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 10;
  in_RDI[2] = 0x3eb0c6f7a0b5ed8d;
  *(undefined1 *)(in_RDI + 4) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 5));
  in_RDI[0xb] = 0;
  uVar2 = SimInfo::getNGlobalConstraints(in_stack_fffffffffffffee0);
  if (uVar2 != 0) {
    *(undefined1 *)(in_RDI + 4) = 1;
  }
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_28 = SimInfo::getSimParams((SimInfo *)*in_RDI);
    this_00 = (ConstraintWriter *)SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
    info_00 = SnapshotManager::getCurrentSnapshot((SnapshotManager *)this_00);
    in_RDI[3] = info_00;
    uVar1 = Globals::haveConstraintTime((Globals *)0x21530f);
    if ((bool)uVar1) {
      in_stack_ffffffffffffff18 = (char *)Globals::getConstraintTime((Globals *)0x21532c);
      in_RDI[10] = in_stack_ffffffffffffff18;
    }
    else {
      in_stack_ffffffffffffff10 = (allocator<char> *)Globals::getStatusTime((Globals *)0x215353);
      in_RDI[10] = in_stack_ffffffffffffff10;
    }
    SimInfo::getFinalConfigFileName_abi_cxx11_(in_stack_fffffffffffffed8);
    getPrefix(in_stack_fffffffffffffee8);
    std::operator+(in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0);
    std::__cxx11::string::operator=((string *)(in_RDI + 5),local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    pvVar3 = operator_new(0x208);
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10);
    ConstraintWriter::ConstraintWriter
              (this_00,(SimInfo *)info_00,(string *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    in_RDI[9] = pvVar3;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (in_RDI[9] == 0) {
      peVar4 = &painCave;
      snprintf(painCave.errMsg,2000,"Failed to create ConstraintWriter\n");
      peVar4->isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

Shake::Shake(SimInfo* info) :
      info_(info), maxConsIteration_(10), consTolerance_(1.0e-6),
      doShake_(false), currConstraintTime_(0.0) {
    if (info_->getNGlobalConstraints() > 0) doShake_ = true;

    if (!doShake_) return;

    Globals* simParams = info_->getSimParams();

    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (simParams->haveConstraintTime()) {
      constraintTime_ = simParams->getConstraintTime();
    } else {
      constraintTime_ = simParams->getStatusTime();
    }

    constraintOutputFile_ =
        getPrefix(info_->getFinalConfigFileName()) + ".constraintForces";

    // create ConstraintWriter
    constraintWriter_ =
        new ConstraintWriter(info_, constraintOutputFile_.c_str());

    if (!constraintWriter_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Failed to create ConstraintWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }